

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

int lrtr_get_monotonic_time(time_t *seconds)

{
  int iVar1;
  long in_FS_OFFSET;
  timespec time;
  timespec local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = clock_gettime(1,&local_20);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    *seconds = local_20.tv_sec;
    iVar1 = 0;
    if (0 < local_20.tv_nsec) {
      *seconds = local_20.tv_sec + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int lrtr_get_monotonic_time(time_t *seconds)
{
#if defined(__MACH__) && defined(__APPLE__)
	if (timeconvert == 0.0) {
		mach_timebase_info_data_t time_base;
		(void)mach_timebase_info(&time_base);
		timeconvert = (double)time_base.numer / (double)time_base.denom / 1000000000.0;
	}
	*seconds = (time_t)mach_absolute_time() * timeconvert;
#else
	struct timespec time;

	if (clock_gettime(CLOCK_MONOTONIC, &time) == -1)
		return -1;
	*seconds = time.tv_sec;
	if ((time.tv_nsec * 1000000000) >= 5)
		*seconds += 1;
#endif
	return 0;
}